

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall lzham::lzcompressor::send_final_block(lzcompressor *this)

{
  symbol_codec *this_00;
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  this_00 = &this->m_codec;
  bVar5 = symbol_codec::start_encoding(this_00,0x10);
  if (((bVar5) &&
      (((this->m_block_index != 0 || (bVar5 = send_configuration(this), bVar5)) &&
       (bVar5 = symbol_codec::encode_bits(this_00,3,2), bVar5)))) &&
     (((bVar5 = symbol_codec::encode_align_to_byte(this_00), bVar5 &&
       (bVar5 = symbol_codec::encode_bits(this_00,this->m_src_adler32,0x20), bVar5)) &&
      (bVar5 = symbol_codec::stop_encoding(this_00,true), bVar5)))) {
    if ((this->m_comp_buf).m_size == 0) {
      puVar2 = (this->m_comp_buf).m_p;
      uVar3 = (this->m_codec).m_output_buf.m_size;
      uVar4 = (this->m_codec).m_output_buf.m_capacity;
      uVar1 = (this->m_comp_buf).m_capacity;
      (this->m_comp_buf).m_p = (this->m_codec).m_output_buf.m_p;
      (this->m_comp_buf).m_size = uVar3;
      (this->m_comp_buf).m_capacity = uVar4;
      (this->m_codec).m_output_buf.m_p = puVar2;
      (this->m_codec).m_output_buf.m_size = 0;
      (this->m_codec).m_output_buf.m_capacity = uVar1;
    }
    else {
      bVar5 = vector<unsigned_char>::append(&this->m_comp_buf,&(this->m_codec).m_output_buf);
      if (!bVar5) {
        return false;
      }
    }
    this->m_block_index = this->m_block_index + 1;
    return true;
  }
  return false;
}

Assistant:

bool lzcompressor::send_final_block()
   {
      //m_codec.clear();

      if (!m_codec.start_encoding(16))
         return false;

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(166, 12))
         return false;
#endif

      if (!m_block_index)
      {
         if (!send_configuration())
            return false;
      }

      if (!m_codec.encode_bits(cEOFBlock, cBlockHeaderBits))
         return false;

      if (!m_codec.encode_align_to_byte())
         return false;

      if (!m_codec.encode_bits(m_src_adler32, 32))
         return false;

      if (!m_codec.stop_encoding(true))
         return false;

      if (m_comp_buf.empty())
      {
         m_comp_buf.swap(m_codec.get_encoding_buf());
      }
      else
      {
         if (!m_comp_buf.append(m_codec.get_encoding_buf()))
            return false;
      }

      m_block_index++;

#if LZHAM_UPDATE_STATS
      m_stats.print();
#endif

      return true;
   }